

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web_connection_base.cpp
# Opt level: O3

void __thiscall
libtorrent::web_connection_base::get_specific_peer_info(web_connection_base *this,peer_info *p)

{
  byte bVar1;
  int iVar2;
  
  if (((this->super_peer_connection).super_peer_connection_hot_members.field_0x28 & 0x10) != 0) {
    *(byte *)&(p->flags).m_val = (byte)(p->flags).m_val | 1;
  }
  iVar2 = (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0xe])(this);
  if ((char)iVar2 != '\0') {
    *(byte *)&(p->flags).m_val = (byte)(p->flags).m_val | 2;
  }
  bVar1 = (this->super_peer_connection).super_peer_connection_hot_members.field_0x28 & 2;
  if ((bVar1 == 0) && ((this->m_server_string)._M_string_length == 0)) {
    *(byte *)&(p->flags).m_val = (byte)(p->flags).m_val | 0x40;
    bVar1 = (this->super_peer_connection).super_peer_connection_hot_members.field_0x28 & 2;
  }
  if (bVar1 != 0) {
    *(byte *)&(p->flags).m_val = (byte)(p->flags).m_val | 0x80;
  }
  std::__cxx11::string::_M_assign((string *)p);
  return;
}

Assistant:

void web_connection_base::get_specific_peer_info(peer_info& p) const
	{
		if (is_interesting()) p.flags |= peer_info::interesting;
		if (is_choked()) p.flags |= peer_info::choked;
		if (!is_connecting() && m_server_string.empty())
			p.flags |= peer_info::handshake;
		if (is_connecting()) p.flags |= peer_info::connecting;

		p.client = m_server_string;
	}